

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
tinyusdz::to_codepoints
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *str)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint32_t cp;
  uint local_4c;
  undefined8 local_48;
  iterator iStack_40;
  pointer local_38;
  
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  iStack_40._M_current._0_4_ = 0;
  iStack_40._M_current._4_4_ = 0;
  local_48 = (void *)0x0;
  iStack_40._M_current = (uint *)0x0;
  local_38 = (pointer)0x0;
  uVar3 = str->_M_string_length;
  if (uVar3 == 0) {
    local_38 = (pointer)0x0;
  }
  else {
    uVar7 = 0;
    do {
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 == (pointer)0x0) goto LAB_0028f918;
      bVar1 = pcVar2[uVar7];
      uVar4 = (uint)bVar1;
      lVar6 = 1;
      if ((char)bVar1 < '\0') {
        if ((bVar1 & 0xe0) == 0xc0) {
          if (((byte)pcVar2[uVar7 + 1] & 0xffffffc0) != 0x80) goto LAB_0028f918;
          uVar4 = (bVar1 & 0x1f) << 6 | (byte)pcVar2[uVar7 + 1] & 0x3f;
          lVar6 = 2;
        }
        else if ((bVar1 & 0xf0) == 0xe0) {
          if ((((byte)pcVar2[uVar7 + 1] & 0xffffffc0) != 0x80) ||
             (((byte)pcVar2[uVar7 + 2] & 0xffffffc0) != 0x80)) goto LAB_0028f918;
          uVar4 = (byte)pcVar2[uVar7 + 2] & 0x3f |
                  ((byte)pcVar2[uVar7 + 1] & 0x3f) << 6 | (bVar1 & 0xf) << 0xc;
          lVar6 = 3;
        }
        else {
          if ((((bVar1 & 0xf8) != 0xf0) || (((byte)pcVar2[uVar7 + 1] & 0xffffffc0) != 0x80)) ||
             (((byte)pcVar2[uVar7 + 2] & 0xffffffc0) != 0x80)) {
LAB_0028f918:
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_48 == (void *)0x0) {
              return __return_storage_ptr__;
            }
            operator_delete(local_48,(long)local_38 - (long)local_48);
            return __return_storage_ptr__;
          }
          uVar5 = ((uint)bVar1 << 0x12 | (uint)(byte)pcVar2[uVar7 + 3]) & 0x1c003f |
                  ((byte)pcVar2[uVar7 + 1] & 0x3f) << 0xc;
          uVar4 = ((byte)pcVar2[uVar7 + 2] & 0x3f) << 6 | uVar5;
          lVar6 = 4;
          local_4c = uVar4;
          if (0x10ffff < uVar5) goto LAB_0028f918;
        }
      }
      local_4c = uVar4;
      if (iStack_40._M_current == local_38) {
        ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,iStack_40,
                   &local_4c);
        uVar3 = str->_M_string_length;
      }
      else {
        *iStack_40._M_current = uVar4;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar7 = uVar7 + lVar6;
    } while (uVar7 < uVar3);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (undefined4)local_48;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_48._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iStack_40._M_current._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish + 4) = iStack_40._M_current._4_4_;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> to_codepoints(const std::string &str) {

  std::vector<uint32_t> cps;

  for (size_t i = 0; i < str.size(); ) {
    uint32_t char_len;
    uint32_t cp = detail::to_codepoint(str.c_str() + i, char_len);

    if ((cp > kMaxUTF8Codepoint) || (char_len == 0)) {
      return std::vector<uint32_t>();
    }

    cps.push_back(cp);

    i += char_len;
  }

  return cps;
}